

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkInfo.cpp
# Opt level: O2

void __thiscall
LinkInfo::fillLinkInfo
          (LinkInfo *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *linkInfo)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__result;
  uint uVar1;
  int iVar2;
  uint uVar3;
  uchar *__last;
  LinkInfo *this_00;
  uchar *__last_00;
  uchar *puVar4;
  const_iterator cVar5;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  
  puVar4 = (linkInfo->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (puVar4,puVar4 + 4,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)this);
  __result = &this->LinkInfoHeaderSize;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (puVar4 + 4,puVar4 + 8,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             __result);
  std::
  __reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((this->LinkInfoHeaderSize).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->LinkInfoHeaderSize).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (puVar4 + 8,puVar4 + 0xc,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->LinkInfoFlags);
  std::
  __reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((this->LinkInfoFlags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (this->LinkInfoFlags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (puVar4 + 0xc,puVar4 + 0x10,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->VolumeIDOffset);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (puVar4 + 0x10,puVar4 + 0x14,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->LocalBasePathOffset);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (puVar4 + 0x14,puVar4 + 0x18,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->CommonNetworkRelativeLinkOffset);
  __last = puVar4 + 0x1c;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (puVar4 + 0x18,__last,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->CommonPathSuffixOffset);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffffb8,
             __result);
  uVar1 = Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              &stack0xffffffffffffffb8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffffb8);
  if (0x23 < uVar1) {
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last,puVar4 + 0x20,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &this->LocalBasePathOffsetUnicode);
    __last = puVar4 + 0x24;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (puVar4 + 0x20,__last,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &this->CommonPathSuffixOffsetUnicode);
  }
  uVar1 = (this->LinkInfoFlags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start[3];
  if (uVar1 == 1) {
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last,__last + 4,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &this->VolumeID);
    std::
    __reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((this->VolumeID).VolumeIDSize.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->VolumeID).VolumeIDSize.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffffa0,
               &(this->VolumeID).VolumeIDSize);
    uVar1 = Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                &stack0xffffffffffffffa0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffffa0
              );
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last + 4,__last + 8,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &(this->VolumeID).DriveType);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last + 8,__last + 0xc,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &(this->VolumeID).DriveSerialNumber);
    puVar4 = __last + 0x10;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last + 0xc,puVar4,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &(this->VolumeID).VolumeLabelOffset);
    std::
    __reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((this->VolumeID).VolumeLabelOffset.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->VolumeID).VolumeLabelOffset.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    __last_00 = puVar4;
    if ((this->VolumeID).VolumeLabelOffset.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[3] != 0x10) {
      __last_00 = __last + 0x14;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (puVar4,__last_00,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &(this->VolumeID).VolumeLabelOffsetUnicode);
      uVar1 = uVar1 - 4;
    }
    cVar5._M_current = __last_00 + (long)(int)uVar1 + -0x10;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last_00,cVar5._M_current,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &(this->VolumeID).Data);
    iVar2 = Utils::getCountOfBytesBeforeNullTerminator(cVar5);
    __last = __last_00 + (long)iVar2 + (long)(int)uVar1 + -0x11;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (cVar5._M_current,__last,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &this->LocalBasePath);
    uVar1 = (this->LinkInfoFlags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[3];
  }
  if (uVar1 == 2) {
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last,__last + 4,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &this->CommonNetworkRelativeLink);
    std::
    __reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((this->CommonNetworkRelativeLink).CommonNetworkRelativeLinkSize.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->CommonNetworkRelativeLink).CommonNetworkRelativeLinkSize.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffff88,
               &(this->CommonNetworkRelativeLink).CommonNetworkRelativeLinkSize);
    Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &stack0xffffffffffffff88);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffff88
              );
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last + 4,__last + 8,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &(this->CommonNetworkRelativeLink).CommonNetworkRelativeLinkFlags);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last + 8,__last + 0xc,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &(this->CommonNetworkRelativeLink).NetNameOffset);
    std::
    __reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((this->CommonNetworkRelativeLink).NetNameOffset.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->CommonNetworkRelativeLink).NetNameOffset.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last + 0xc,__last + 0x10,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &(this->CommonNetworkRelativeLink).DeviceNameOffset);
    puVar4 = __last + 0x14;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last + 0x10,puVar4,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &(this->CommonNetworkRelativeLink).NetworkProviderType);
    if (0x14 < (this->CommonNetworkRelativeLink).NetNameOffset.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[3]) {
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (puVar4,__last + 0x18,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &(this->CommonNetworkRelativeLink).NetNameOffsetUnicode);
      puVar4 = __last + 0x1c;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (__last + 0x18,puVar4,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &(this->CommonNetworkRelativeLink).DeviceNameOffsetUnicode);
    }
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (puVar4,puVar4 + 4,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &(this->CommonNetworkRelativeLink).NetName);
    __last = puVar4 + 8;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (puVar4 + 4,__last,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &(this->CommonNetworkRelativeLink).DeviceName);
    if (0x14 < (this->CommonNetworkRelativeLink).NetNameOffset.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[3]) {
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (__last,puVar4 + 0xc,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &(this->CommonNetworkRelativeLink).NetNameUnicode);
      __last = puVar4 + 0x10;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (puVar4 + 0xc,__last,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &(this->CommonNetworkRelativeLink).DeviceNameUnicode);
    }
  }
  std::
  __reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((this->LinkInfoSize).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (this->LinkInfoSize).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::
  __reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((this->CommonPathSuffixOffset).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->CommonPathSuffixOffset).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffff70,
             &this->LinkInfoSize);
  uVar1 = Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              &stack0xffffffffffffff70);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d8,
             &this->CommonPathSuffixOffset);
  uVar3 = Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_d8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffff70);
  cVar5._M_current = __last + (int)(uVar1 - uVar3);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (__last,cVar5._M_current,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->CommonPathSuffix);
  if ((this->LinkInfoFlags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[3] == 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffff58,
               __result);
    uVar1 = Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                &stack0xffffffffffffff58);
    this_00 = (LinkInfo *)&stack0xffffffffffffff58;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
    if (0x23 < uVar1) {
      iVar2 = getCountOfBytesBeforeNullTerminatorForLBP(this_00,cVar5);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (cVar5._M_current,cVar5._M_current + iVar2,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &this->LocalBasePathUnicode);
      cVar5._M_current = cVar5._M_current + iVar2;
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c0,__result);
  uVar1 = Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_c0);
  if (0x23 < uVar1) {
    iVar2 = Utils::getCountOfBytesBeforeNullTerminator(cVar5);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (cVar5._M_current,cVar5._M_current + iVar2,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &this->CommonPathSuffixUnicode);
  }
  reverseAllFields(this);
  return;
}

Assistant:

void LinkInfo::fillLinkInfo(std::vector<unsigned char> linkInfo) {
    auto it = linkInfo.begin();
   /* mandatory fields */
    copy(it, it + 4, std::back_inserter(LinkInfoSize));                         // 4 byte
    it = it + 4;
    copy(it, it + 4, std::back_inserter(LinkInfoHeaderSize));                   // 4 byte
    it = it + 4;
    reverse(LinkInfoHeaderSize.begin(), LinkInfoHeaderSize.end());                              // Нужно для дальнейшей проверки

    copy(it, it + 4, std::back_inserter(LinkInfoFlags));                        // 4 byte
    it = it + 4;
    reverse(LinkInfoFlags.begin(), LinkInfoFlags.end());                                        // Нужно для дальнейшей проверки

    copy(it, it + 4, std::back_inserter(VolumeIDOffset));                       // 4 byte
    it = it + 4;
    copy(it, it + 4, std::back_inserter(LocalBasePathOffset));                  // 4 byte
    it = it + 4;
    copy(it, it+ 4, std::back_inserter(CommonNetworkRelativeLinkOffset));      // 4 byte
    it = it + 4;
    copy(it, it + 4, std::back_inserter(CommonPathSuffixOffset));               // 4 byte
    it = it + 4;

    /* optional fields */
    /* if the value of the LinkInfoHeaderSize field is greater than or equal to 0x00000024. */
    if (Utils::lenFourBytes(LinkInfoHeaderSize) >= 0x00000024) {
        /* if the VolumeIDAndLocalBasePath flag is set, this value is an offset, in bytes,
        from the start of the LinkInfo structure; otherwise, this value MUST be zero */
        copy(it, it + 4, std::back_inserter(LocalBasePathOffsetUnicode));       // 4 byte
        it = it + 4;
        copy(it, it + 4, std::back_inserter(CommonPathSuffixOffsetUnicode));    // 4 byte
        it = it + 4;
    }

    //  if the VolumeIDAndLocalBasePath flag is set.
    if (LinkInfoFlags[3] == VolumeIDAndLocalBasePath) {
        /* VolumeID structure */
        copy(it, it + 4, std::back_inserter(VolumeID.VolumeIDSize));                    // 4 byte
        it = it + 4;
        reverse(VolumeID.VolumeIDSize.begin(), VolumeID.VolumeIDSize.end());

        int count = Utils::lenFourBytes(VolumeID.VolumeIDSize);
        copy(it, it + 4, std::back_inserter(VolumeID.DriveType));                       // 4 byte
        it = it + 4;
        copy(it, it + 4, std::back_inserter(VolumeID.DriveSerialNumber));               // 4 byte
        it = it + 4;
        copy(it, it + 4, std::back_inserter(VolumeID.VolumeLabelOffset));               // 4 byte
        it = it + 4;
        reverse(VolumeID.VolumeLabelOffset.begin(), VolumeID.VolumeLabelOffset.end());     // Нужно для дальнейшей проверки

        /* optional fields */
        if (VolumeID.VolumeLabelOffset[3] != 0x00000010) {   // По документации 14
            copy(it, it + 4, std::back_inserter(VolumeID.VolumeLabelOffsetUnicode));    // 4 byte
            it = it + 4;
            count = count - 4;
        }

        copy(it, it + count - 16, std::back_inserter(VolumeID.Data));                   // 4 byte
        it = it + count - 16;
        /* end of VolumeID structure*/

        /* LocalBasePathOffset specifies the location of the LocalBasePath field */
        //NULL–terminated string
        int countBytesBeforeNullTerminated  = Utils::getCountOfBytesBeforeNullTerminator(it);
        copy(it, it + countBytesBeforeNullTerminated - 1, std::back_inserter(LocalBasePath));
        it = it + countBytesBeforeNullTerminated - 1;
    }

    /* if LinkInfoFlags  = CommonNetworkRelativeLinkAndPathSuffix (gj CommonNetworkRelativeLinkOffset ) */
    if (LinkInfoFlags[3] == CommonNetworkRelativeLinkAndPathSuffix) {
        /* fill CommonNetworkRelativeLink structure */
        copy(it, it + 4, std::back_inserter(
                CommonNetworkRelativeLink.CommonNetworkRelativeLinkSize));                    // 4 byte
        it = it + 4;
        reverse(CommonNetworkRelativeLink.CommonNetworkRelativeLinkSize.begin(),
                CommonNetworkRelativeLink.CommonNetworkRelativeLinkSize.end());
        int count = Utils::lenFourBytes(CommonNetworkRelativeLink.CommonNetworkRelativeLinkSize);
        copy(it, it + 4, std::back_inserter(
                CommonNetworkRelativeLink.CommonNetworkRelativeLinkFlags));                   // 4 byte
        it = it + 4;
        copy(it, it + 4, std::back_inserter(
                CommonNetworkRelativeLink.NetNameOffset));                                    // 4 byte
        it = it + 4;
        reverse(CommonNetworkRelativeLink.NetNameOffset.begin(),
                CommonNetworkRelativeLink.NetNameOffset.end());

        copy(it, it + 4, std::back_inserter(
                CommonNetworkRelativeLink.DeviceNameOffset));                                 // 4 byte
        it = it + 4;
        copy(it, it + 4, std::back_inserter(
                CommonNetworkRelativeLink.NetworkProviderType));                              // 4 byte
        it = it + 4;
        /* optional fields */
        /* if the value of the NetNameOffset field is greater than 0x00000014 */
        if (CommonNetworkRelativeLink.NetNameOffset[3] > 0x00000014) {
            copy(it, it + 4, std::back_inserter(
                    CommonNetworkRelativeLink.NetNameOffsetUnicode));                         // 4 byte
            it = it + 4;
            copy(it, it + 4, std::back_inserter(
                    CommonNetworkRelativeLink.DeviceNameOffsetUnicode));                      // 4 byte
            it = it + 4;
        }
        /* end optional fields */
        copy(it, it + 4, std::back_inserter(
                CommonNetworkRelativeLink.NetName));
        it = it + 4;
        copy(it, it + 4, std::back_inserter(
                CommonNetworkRelativeLink.DeviceName));
        it = it + 4;
        /* optional fields */
        /* NetNameOffset field is greater than 0x00000014 */
        if (CommonNetworkRelativeLink.NetNameOffset[3] > 0x00000014) {
            copy(it, it + 4, std::back_inserter(
                    CommonNetworkRelativeLink.NetNameUnicode));
            it = it + 4;
            copy(it, it + 4, std::back_inserter(
                    CommonNetworkRelativeLink.DeviceNameUnicode));
            it = it + 4;
        }
        /* end CommonNetworkRelativeLink structure */
    }

    reverse(LinkInfoSize.begin(), LinkInfoSize.end());
    reverse(CommonPathSuffixOffset.begin(), CommonPathSuffixOffset.end());
    int len = Utils::lenFourBytes(LinkInfoSize) - Utils::lenFourBytes(CommonPathSuffixOffset);
    copy(it, it + len, std::back_inserter(CommonPathSuffix));
    it = it + len;

    /* optional fields */
    /* VolumeIDAndLocalBasePath flag is set and the value of the LinkInfoHeaderSize
       field is greater than or equal to 0x00000024. */
    if (LinkInfoFlags[3] == VolumeIDAndLocalBasePath && Utils::lenFourBytes(LinkInfoHeaderSize) >= 0x00000024) {
        int countBytesBeforeNullTerminated  = LinkInfo::getCountOfBytesBeforeNullTerminatorForLBP(it);
        copy(it, it + countBytesBeforeNullTerminated, std::back_inserter(LocalBasePathUnicode));
        it = it + countBytesBeforeNullTerminated;
    }

    /* if the value of the LinkInfoHeaderSize field is greater than or equal to 0x00000024. */
    if (Utils::lenFourBytes(LinkInfoHeaderSize) >= 0x00000024) {
        int countBytesBeforeNullTerminated  = Utils::getCountOfBytesBeforeNullTerminator(it);
        copy(it, it + countBytesBeforeNullTerminated, std::back_inserter(CommonPathSuffixUnicode));
    }
    LinkInfo::reverseAllFields();
}